

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

bool absl::GenericCompare<bool,absl::Cord>(Cord *lhs,Cord *rhs,size_t size_to_compare)

{
  int iVar1;
  ulong __n;
  string_view sVar2;
  string_view sVar3;
  
  sVar2 = Cord::GetFirstChunk(lhs);
  sVar3 = Cord::GetFirstChunk(rhs);
  __n = sVar2._M_len;
  if (sVar3._M_len < sVar2._M_len) {
    __n = sVar3._M_len;
  }
  if (__n <= size_to_compare) {
    if (__n == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = memcmp(sVar2._M_str,sVar3._M_str,__n);
    }
    if (iVar1 == 0 && __n != size_to_compare) {
      iVar1 = Cord::CompareSlowPath(lhs,rhs,__n,size_to_compare);
    }
    return iVar1 == 0;
  }
  __assert_fail("size_to_compare >= compared_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/cord.cc"
                ,0x3d1,
                "ResultType absl::GenericCompare(const Cord &, const RHS &, size_t) [ResultType = bool, RHS = absl::Cord]"
               );
}

Assistant:

ResultType GenericCompare(const Cord& lhs, const RHS& rhs,
                          size_t size_to_compare) {
  absl::string_view lhs_chunk = Cord::GetFirstChunk(lhs);
  absl::string_view rhs_chunk = Cord::GetFirstChunk(rhs);

  size_t compared_size = std::min(lhs_chunk.size(), rhs_chunk.size());
  assert(size_to_compare >= compared_size);
  int memcmp_res = compared_size > 0 ? ::memcmp(lhs_chunk.data(),
                                                rhs_chunk.data(), compared_size)
                                     : 0;
  if (compared_size == size_to_compare || memcmp_res != 0) {
    return ComputeCompareResult<ResultType>(memcmp_res);
  }

  return ComputeCompareResult<ResultType>(
      lhs.CompareSlowPath(rhs, compared_size, size_to_compare));
}